

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O0

void ngx_chain_update_chains
               (ngx_pool_t *p,ngx_chain_t **free,ngx_chain_t **busy,ngx_chain_t **out,
               ngx_buf_tag_t tag)

{
  ngx_chain_t *pnVar1;
  long local_40;
  ngx_chain_t *local_38;
  ngx_chain_t *cl;
  ngx_buf_tag_t tag_local;
  ngx_chain_t **out_local;
  ngx_chain_t **busy_local;
  ngx_chain_t **free_local;
  ngx_pool_t *p_local;
  
  if (*out != (ngx_chain_t *)0x0) {
    if (*busy == (ngx_chain_t *)0x0) {
      *busy = *out;
    }
    else {
      for (local_38 = *busy; local_38->next != (ngx_chain_t *)0x0; local_38 = local_38->next) {
      }
      local_38->next = *out;
    }
    *out = (ngx_chain_t *)0x0;
  }
  while( true ) {
    if (*busy == (ngx_chain_t *)0x0) {
      return;
    }
    pnVar1 = *busy;
    if ((((*(ushort *)&pnVar1->buf->field_0x48 & 1) == 0) &&
        ((*(ushort *)&pnVar1->buf->field_0x48 >> 1 & 1) == 0)) &&
       ((*(ushort *)&pnVar1->buf->field_0x48 >> 2 & 1) == 0)) {
      local_40 = pnVar1->buf->file_last - pnVar1->buf->file_pos;
    }
    else {
      local_40 = (long)pnVar1->buf->last - (long)pnVar1->buf->pos;
    }
    if (local_40 != 0) break;
    if (pnVar1->buf->tag == tag) {
      pnVar1->buf->pos = pnVar1->buf->start;
      pnVar1->buf->last = pnVar1->buf->start;
      *busy = pnVar1->next;
      pnVar1->next = *free;
      *free = pnVar1;
    }
    else {
      *busy = pnVar1->next;
      pnVar1->next = p->chain;
      p->chain = pnVar1;
    }
  }
  return;
}

Assistant:

void
ngx_chain_update_chains(ngx_pool_t *p, ngx_chain_t **free, ngx_chain_t **busy,
    ngx_chain_t **out, ngx_buf_tag_t tag)
{
    ngx_chain_t  *cl;

    if (*out) {
        if (*busy == NULL) {
            *busy = *out;

        } else {
            for (cl = *busy; cl->next; cl = cl->next) { /* void */ }

            cl->next = *out;
        }

        *out = NULL;
    }

    while (*busy) {
        cl = *busy;

        if (ngx_buf_size(cl->buf) != 0) {
            break;
        }

        if (cl->buf->tag != tag) {
            *busy = cl->next;
            ngx_free_chain(p, cl);
            continue;
        }

        cl->buf->pos = cl->buf->start;
        cl->buf->last = cl->buf->start;

        *busy = cl->next;
        cl->next = *free;
        *free = cl;
    }
}